

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O3

void eltcalc::GetEventRates<occurrence>(occurrence *occ,FILE *fin)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  const_iterator __pos;
  _Base_ptr p_Var7;
  float *pfVar8;
  int iVar9;
  bool bVar10;
  int no_of_periods;
  tuple<> tStack_41;
  _Head_base<0UL,_const_float_&,_false> _Stack_40;
  double local_38;
  int local_2c;
  
  local_2c = 0;
  _Stack_40._M_head_impl = (float *)0x103598;
  fread(&local_2c,4,1,(FILE *)fin);
  pfVar8 = (float *)0xc;
  _Stack_40._M_head_impl = (float *)0x1035ad;
  sVar4 = fread(occ,0xc,1,(FILE *)fin);
  iVar3 = local_2c;
  if (sVar4 == 0) {
    iVar9 = 0;
  }
  else {
    local_38 = 1.0 / (double)local_2c;
    iVar9 = 0;
    do {
      _Stack_40._M_head_impl = (float *)0x1035df;
      pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)event_rate_,&occ->event_id);
      *pmVar5 = *pmVar5 + local_38;
      if (iVar9 <= occ->period_no) {
        iVar9 = occ->period_no;
      }
      pfVar8 = (float *)0xc;
      _Stack_40._M_head_impl = (float *)0x10360c;
      sVar4 = fread(occ,0xc,1,(FILE *)fin);
    } while (sVar4 != 0);
  }
  _Stack_40._M_head_impl = (float *)0x10361e;
  fclose((FILE *)fin);
  if (iVar3 < iVar9) {
    _Stack_40._M_head_impl = (float *)0x103635;
    GetEventRates<occurrence>();
    p_Var7 = *(_Base_ptr *)
              ((_Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
                *)fin + 0x10);
    __pos._M_node =
         (_Base_ptr)
         ((_Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
           *)fin + 8);
    if (p_Var7 != (_Base_ptr)0x0) {
      fVar1 = *pfVar8;
      p_Var6 = __pos._M_node;
      do {
        bVar10 = fVar1 != (float)p_Var7[1]._M_color;
        bVar2 = (float)p_Var7[1]._M_color <= fVar1;
        if (!bVar2 || !bVar10) {
          p_Var6 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[bVar2 && bVar10];
      } while (p_Var7 != (_Base_ptr)0x0);
      bVar10 = p_Var6 != __pos._M_node;
      __pos._M_node = p_Var6;
      if ((bVar10) && ((float)p_Var6[1]._M_color <= fVar1)) {
        return;
      }
    }
    _Stack_40._M_head_impl = pfVar8;
    std::
    _Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
    ::
    _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<float_const&>,std::tuple<>>
              ((_Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
                *)fin,__pos,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<const_float_&> *)&_Stack_40,&tStack_41);
    return;
  }
  return;
}

Assistant:

void GetEventRates(T &occ, FILE * fin)
	{
		// Calculate event rates from occurrence file
		int max_period_no = 0;
		int no_of_periods = 0;
		size_t i = fread(&no_of_periods, sizeof(no_of_periods), 1, fin);
		i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			event_rate_[occ.event_id] += 1 / (double)no_of_periods;
			if (max_period_no < occ.period_no)
				max_period_no = occ.period_no;
			i = fread(&occ, sizeof(occ), 1, fin);
		}
		fclose(fin);

		if (max_period_no > no_of_periods) {
			fprintf(stderr, "FATAL: Maximum period number in occurrence file exceeds that in header.\n");
			exit(EXIT_FAILURE);
		}
	}